

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elsa.h
# Opt level: O1

size_t __thiscall
frozen::bits::pmh_tables<256ul,frozen::elsa<int>>::lookup<int,frozen::elsa<int>>
          (pmh_tables<256ul,frozen::elsa<int>> *this,int *key,elsa<int> *hasher)

{
  ulong uVar1;
  
  uVar1 = *(ulong *)this ^ (long)*key;
  uVar1 = uVar1 * 0x200000 + ~uVar1;
  uVar1 = (uVar1 >> 0x18 ^ uVar1) * 0x109;
  uVar1 = (uVar1 >> 0xe ^ uVar1) * 0x15;
  uVar1 = *(ulong *)(this + (ulong)(((uint)(uVar1 >> 0x1c) ^ (uint)uVar1) & 0xff) * 8 + 8);
  if (-1 < (long)uVar1) {
    return uVar1;
  }
  uVar1 = uVar1 ^ (long)*key;
  uVar1 = uVar1 * 0x200000 + ~uVar1;
  uVar1 = (uVar1 >> 0x18 ^ uVar1) * 0x109;
  uVar1 = (uVar1 >> 0xe ^ uVar1) * 0x15;
  return *(size_t *)(this + (ulong)(((uint)(uVar1 >> 0x1c) ^ (uint)uVar1) & 0xff) * 8 + 0x808);
}

Assistant:

constexpr std::size_t operator()(T const &value, std::size_t seed) const {
    std::size_t key = seed ^ static_cast<std::size_t>(value);
    key = (~key) + (key << 21); // key = (key << 21) - key - 1;
    key = key ^ (key >> 24);
    key = (key + (key << 3)) + (key << 8); // key * 265
    key = key ^ (key >> 14);
    key = (key + (key << 2)) + (key << 4); // key * 21
    key = key ^ (key >> 28);
    key = key + (key << 31);
    return key;
  }